

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

optional<sub_bound_token> *
read_right_bound_token
          (optional<sub_bound_token> *__return_storage_ptr__,string_view buf_1,string_view buf_2,
          string_view buf_3,string_view buf_4)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  double dVar1;
  bool bVar2;
  operator_token *poVar3;
  double *pdVar4;
  size_t sVar5;
  char *pcVar6;
  optional<operator_token> oVar7;
  optional<double> oVar8;
  sub_bound_token local_210;
  size_t local_200;
  char *local_1f8;
  _Storage<double,_true> local_1f0;
  optional<double> value_opt_3;
  sub_bound_token local_1d8;
  size_t local_1c8;
  char *local_1c0;
  _Storage<double,_true> local_1b8;
  optional<double> value_opt_2;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_188;
  size_t local_178;
  char *local_170;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_168;
  size_t local_158;
  char *local_150;
  sub_bound_token local_140;
  size_t local_130;
  char *local_128;
  _Storage<double,_true> local_120;
  optional<double> value_opt_1;
  sub_bound_token local_108;
  size_t local_f8;
  char *local_f0;
  _Storage<double,_true> local_e8;
  optional<double> value_opt;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_b8;
  size_t local_a8;
  char *local_a0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_98;
  size_t local_88;
  char *local_80;
  _Storage<operator_token,_true> local_78;
  operator_type local_70;
  size_t local_68;
  char *pcStack_60;
  size_t local_58;
  char *pcStack_50;
  _Storage<operator_token,_true> local_40;
  optional<operator_token> operator_token;
  operator_type op;
  double negative;
  string_view buf_2_local;
  string_view buf_1_local;
  
  pcVar6 = buf_2._M_str;
  sVar5 = buf_2._M_len;
  pcStack_50 = buf_1._M_str;
  local_58 = buf_1._M_len;
  stack0xffffffffffffffd0 = 1.0;
  operator_token.super__Optional_base<operator_token,_true,_true>._M_payload.
  super__Optional_payload_base<operator_token>._M_payload._M_value.read = 0;
  local_68 = sVar5;
  pcStack_60 = pcVar6;
  oVar7 = read_operator(buf_1,buf_2);
  local_78 = oVar7.super__Optional_base<operator_token,_true,_true>._M_payload.
             super__Optional_payload_base<operator_token>._M_payload;
  local_70 = CONCAT31(local_70._1_3_,
                      oVar7.super__Optional_base<operator_token,_true,_true>._M_payload.
                      super__Optional_payload_base<operator_token>._M_engaged);
  operator_token.super__Optional_base<operator_token,_true,_true>._M_payload.
  super__Optional_payload_base<operator_token>._M_payload._M_value.op = local_70;
  local_40 = local_78;
  bVar2 = std::optional::operator_cast_to_bool((optional *)&local_40._M_value);
  if (bVar2) {
    poVar3 = std::optional<operator_token>::operator->
                       ((optional<operator_token> *)&local_40._M_value);
    operator_token.super__Optional_base<operator_token,_true,_true>._M_payload.
    super__Optional_payload_base<operator_token>._M_payload._M_value.read = poVar3->op;
    poVar3 = std::optional<operator_token>::operator->
                       ((optional<operator_token> *)&local_40._M_value);
    if (poVar3->read == 1) {
      local_88 = sVar5;
      local_80 = pcVar6;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_98,"+");
      __x_02._M_str = local_80;
      __x_02._M_len = local_88;
      bVar2 = std::operator==(__x_02,local_98);
      if (!bVar2) {
        local_a8 = sVar5;
        local_a0 = pcVar6;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b8,"-");
        __x_01._M_str = local_a0;
        __x_01._M_len = local_a8;
        bVar2 = std::operator==(__x_01,local_b8);
        if (!bVar2) {
          local_130 = sVar5;
          local_128 = pcVar6;
          oVar8 = read_real(buf_2);
          local_120 = oVar8.super__Optional_base<double,_true,_true>._M_payload.
                      super__Optional_payload_base<double>._M_payload;
          value_opt_1.super__Optional_base<double,_true,_true>._M_payload.
          super__Optional_payload_base<double>._M_payload._0_1_ =
               oVar8.super__Optional_base<double,_true,_true>._M_payload.
               super__Optional_payload_base<double>._M_engaged;
          bVar2 = std::optional::operator_cast_to_bool((optional *)&local_120);
          dVar1 = stack0xffffffffffffffd0;
          if (!bVar2) {
            std::optional<sub_bound_token>::optional(__return_storage_ptr__);
            return __return_storage_ptr__;
          }
          pdVar4 = std::optional<double>::operator*((optional<double> *)&local_120);
          sub_bound_token::sub_bound_token
                    (&local_140,dVar1 * *pdVar4,2,
                     operator_token.super__Optional_base<operator_token,_true,_true>._M_payload.
                     super__Optional_payload_base<operator_token>._M_payload._M_value.read);
          std::optional<sub_bound_token>::optional<sub_bound_token,_true>
                    (__return_storage_ptr__,&local_140);
          return __return_storage_ptr__;
        }
      }
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 &value_opt.super__Optional_base<double,_true,_true>._M_payload.
                  super__Optional_payload_base<double>._M_engaged,"-");
      bVar2 = std::operator==(buf_2,stack0xffffffffffffff28);
      if (bVar2) {
        stack0xffffffffffffffd0 = -1.0;
      }
      local_f8 = buf_3._M_len;
      local_f0 = buf_3._M_str;
      oVar8 = read_real(buf_3);
      local_e8 = oVar8.super__Optional_base<double,_true,_true>._M_payload.
                 super__Optional_payload_base<double>._M_payload;
      value_opt.super__Optional_base<double,_true,_true>._M_payload.
      super__Optional_payload_base<double>._M_payload._0_1_ =
           oVar8.super__Optional_base<double,_true,_true>._M_payload.
           super__Optional_payload_base<double>._M_engaged;
      bVar2 = std::optional::operator_cast_to_bool((optional *)&local_e8);
      dVar1 = stack0xffffffffffffffd0;
      if (bVar2) {
        pdVar4 = std::optional<double>::operator*((optional<double> *)&local_e8);
        sub_bound_token::sub_bound_token
                  (&local_108,dVar1 * *pdVar4,3,
                   operator_token.super__Optional_base<operator_token,_true,_true>._M_payload.
                   super__Optional_payload_base<operator_token>._M_payload._M_value.read);
        std::optional<sub_bound_token>::optional<sub_bound_token,_true>
                  (__return_storage_ptr__,&local_108);
      }
      else {
        std::optional<sub_bound_token>::optional(__return_storage_ptr__);
      }
    }
    else {
      local_158 = buf_3._M_len;
      local_150 = buf_3._M_str;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_168,"+");
      __x_00._M_str = local_150;
      __x_00._M_len = local_158;
      bVar2 = std::operator==(__x_00,local_168);
      if (!bVar2) {
        local_178 = buf_3._M_len;
        local_170 = buf_3._M_str;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_188,"-");
        __x._M_str = local_170;
        __x._M_len = local_178;
        bVar2 = std::operator==(__x,local_188);
        if (!bVar2) {
          local_200 = buf_3._M_len;
          local_1f8 = buf_3._M_str;
          oVar8 = read_real(buf_3);
          local_1f0 = oVar8.super__Optional_base<double,_true,_true>._M_payload.
                      super__Optional_payload_base<double>._M_payload;
          value_opt_3.super__Optional_base<double,_true,_true>._M_payload.
          super__Optional_payload_base<double>._M_payload._0_1_ =
               oVar8.super__Optional_base<double,_true,_true>._M_payload.
               super__Optional_payload_base<double>._M_engaged;
          bVar2 = std::optional::operator_cast_to_bool((optional *)&local_1f0);
          dVar1 = stack0xffffffffffffffd0;
          if (!bVar2) {
            std::optional<sub_bound_token>::optional(__return_storage_ptr__);
            return __return_storage_ptr__;
          }
          pdVar4 = std::optional<double>::operator*((optional<double> *)&local_1f0);
          sub_bound_token::sub_bound_token
                    (&local_210,dVar1 * *pdVar4,3,
                     operator_token.super__Optional_base<operator_token,_true,_true>._M_payload.
                     super__Optional_payload_base<operator_token>._M_payload._M_value.read);
          std::optional<sub_bound_token>::optional<sub_bound_token,_true>
                    (__return_storage_ptr__,&local_210);
          return __return_storage_ptr__;
        }
      }
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 &value_opt_2.super__Optional_base<double,_true,_true>._M_payload.
                  super__Optional_payload_base<double>._M_engaged,"-");
      bVar2 = std::operator==(buf_3,stack0xfffffffffffffe58);
      if (bVar2) {
        stack0xffffffffffffffd0 = -1.0;
      }
      local_1c8 = buf_4._M_len;
      local_1c0 = buf_4._M_str;
      oVar8 = read_real(buf_4);
      local_1b8 = oVar8.super__Optional_base<double,_true,_true>._M_payload.
                  super__Optional_payload_base<double>._M_payload;
      value_opt_2.super__Optional_base<double,_true,_true>._M_payload.
      super__Optional_payload_base<double>._M_payload._0_1_ =
           oVar8.super__Optional_base<double,_true,_true>._M_payload.
           super__Optional_payload_base<double>._M_engaged;
      bVar2 = std::optional::operator_cast_to_bool((optional *)&local_1b8);
      dVar1 = stack0xffffffffffffffd0;
      if (bVar2) {
        pdVar4 = std::optional<double>::operator*((optional<double> *)&local_1b8);
        sub_bound_token::sub_bound_token
                  (&local_1d8,dVar1 * *pdVar4,4,
                   operator_token.super__Optional_base<operator_token,_true,_true>._M_payload.
                   super__Optional_payload_base<operator_token>._M_payload._M_value.read);
        std::optional<sub_bound_token>::optional<sub_bound_token,_true>
                  (__return_storage_ptr__,&local_1d8);
      }
      else {
        std::optional<sub_bound_token>::optional(__return_storage_ptr__);
      }
    }
  }
  else {
    std::optional<sub_bound_token>::optional(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<sub_bound_token>
read_right_bound_token(const std::string_view buf_1,
                       const std::string_view buf_2,
                       const std::string_view buf_3,
                       const std::string_view buf_4) noexcept
{
    double negative = 1.0;
    baryonyx::operator_type op = baryonyx::operator_type::equal;

    if (auto operator_token = read_operator(buf_1, buf_2); operator_token) {
        op = operator_token->op;
        if (operator_token->read == 1) {
            if (buf_2 == "+" || buf_2 == "-") {
                if (buf_2 == "-")
                    negative = -1.0;

                if (auto value_opt = read_real(buf_3); value_opt)
                    return sub_bound_token(negative * *value_opt, 3, op);
                else
                    return std::nullopt;
            } else {
                if (auto value_opt = read_real(buf_2); value_opt)
                    return sub_bound_token(negative * *value_opt, 2, op);
                else
                    return std::nullopt;
            }
        } else {
            if (buf_3 == "+" || buf_3 == "-") {
                if (buf_3 == "-")
                    negative = -1.0;

                if (auto value_opt = read_real(buf_4); value_opt)
                    return sub_bound_token(negative * *value_opt, 4, op);
                else
                    return std::nullopt;
            } else {
                if (auto value_opt = read_real(buf_3); value_opt)
                    return sub_bound_token(negative * *value_opt, 3, op);
                else
                    return std::nullopt;
            }
        }
    } else
        return std::nullopt;
}